

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

ASN1_STRING * ASN1_STRING_dup(ASN1_STRING *a)

{
  int iVar1;
  ASN1_STRING *ret;
  ASN1_STRING *str_local;
  
  if (a == (ASN1_STRING *)0x0) {
    str_local = (ASN1_STRING *)0x0;
  }
  else {
    str_local = (ASN1_STRING *)ASN1_STRING_new();
    if (str_local == (ASN1_STRING *)0x0) {
      str_local = (ASN1_STRING *)0x0;
    }
    else {
      iVar1 = ASN1_STRING_copy((ASN1_STRING *)str_local,a);
      if (iVar1 == 0) {
        ASN1_STRING_free((ASN1_STRING *)str_local);
        str_local = (ASN1_STRING *)0x0;
      }
    }
  }
  return (ASN1_STRING *)str_local;
}

Assistant:

ASN1_STRING *ASN1_STRING_dup(const ASN1_STRING *str) {
  ASN1_STRING *ret;
  if (!str) {
    return NULL;
  }
  ret = ASN1_STRING_new();
  if (!ret) {
    return NULL;
  }
  if (!ASN1_STRING_copy(ret, str)) {
    ASN1_STRING_free(ret);
    return NULL;
  }
  return ret;
}